

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_key_usage(uchar **p,uchar *end,uint *key_usage)

{
  int low;
  undefined1 local_50 [8];
  mbedtls_x509_bitstring bs;
  size_t i;
  int ret;
  uint *key_usage_local;
  uchar *end_local;
  uchar **p_local;
  
  memset(local_50,0,0x18);
  low = mbedtls_asn1_get_bitstring(p,end,(mbedtls_asn1_bitstring *)local_50);
  if (low == 0) {
    if (local_50 == (undefined1  [8])0x0) {
      *key_usage = 0;
      p_local._4_4_ = 0;
    }
    else {
      *key_usage = 0;
      for (bs.p = (uchar *)0x0; bs.p < (ulong)local_50 && bs.p < (uchar *)0x4; bs.p = bs.p + 1) {
        *key_usage = (uint)bs.p[bs._8_8_] << ((byte)((long)bs.p << 3) & 0x1f) | *key_usage;
      }
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,low,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                           ,0x55f);
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_key_usage(unsigned char **p,
                               const unsigned char *end,
                               unsigned int *key_usage)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if ((ret = mbedtls_asn1_get_bitstring(p, end, &bs)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    /* A bitstring with no flags set is still technically valid, as it will mean
       that the certificate has no designated purpose at the time of creation. */
    if (bs.len == 0) {
        *key_usage = 0;
        return 0;
    }

    /* Get actual bitstring */
    *key_usage = 0;
    for (i = 0; i < bs.len && i < sizeof(unsigned int); i++) {
        *key_usage |= (unsigned int) bs.p[i] << (8*i);
    }

    return 0;
}